

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Text.cpp
# Opt level: O3

void __thiscall Text::_drawList(Text *this)

{
  GLfloat GVar1;
  GLfloat GVar2;
  ulong uVar3;
  size_t sVar4;
  float *pfVar5;
  ulong uVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  
  (*glad_glEnable)(0xde1);
  (*glad_glBindTexture)(0xde1,(this->_texture).id);
  uVar3 = (this->text)._M_string_length;
  if (uVar3 != 0) {
    fVar8 = this->x;
    fVar10 = this->y;
    uVar6 = 0;
    do {
      sVar4 = (this->_font).glyphs_count;
      if (sVar4 != 0) {
        pfVar5 = &((this->_font).glyphs.
                   super__Vector_base<texture_glyph_t,_std::allocator<texture_glyph_t>_>._M_impl.
                   super__Vector_impl_data._M_start)->t1;
        do {
          if (((anon_struct_80_13_17081b74 *)(pfVar5 + -10))->charcode ==
              (int)(this->text)._M_dataplus._M_p[uVar6]) {
            fVar11 = (float)(int)pfVar5[-7] + fVar8 + this->kerning;
            GVar1 = pfVar5[-9];
            fVar12 = (float)(int)pfVar5[-6] + fVar10;
            GVar2 = pfVar5[-8];
            (*glad_glBegin)(4);
            (*glad_glColor4f)(1.0,1.0,1.0,1.0);
            (*glad_glTexCoord2f)(pfVar5[-3],pfVar5[-2]);
            (*glad_glVertex3f)(fVar11,fVar12,this->z);
            (*glad_glTexCoord2f)(pfVar5[-3],*pfVar5);
            fVar9 = fVar12 - (float)(int)GVar2;
            (*glad_glVertex3f)(fVar11,fVar9,this->z);
            (*glad_glTexCoord2f)(pfVar5[-1],*pfVar5);
            fVar7 = (float)(int)GVar1 + fVar11;
            (*glad_glVertex3f)(fVar7,fVar9,this->z);
            (*glad_glTexCoord2f)(pfVar5[-3],pfVar5[-2]);
            (*glad_glVertex3f)(fVar11,fVar12,this->z);
            (*glad_glTexCoord2f)(pfVar5[-1],*pfVar5);
            (*glad_glVertex3f)(fVar7,fVar9,this->z);
            (*glad_glTexCoord2f)(pfVar5[-1],pfVar5[-2]);
            (*glad_glVertex3f)(fVar7,fVar12,this->z);
            (*glad_glEnd)();
            fVar8 = fVar8 + pfVar5[-5];
            fVar10 = fVar10 + pfVar5[-4];
            uVar3 = (this->text)._M_string_length;
            break;
          }
          pfVar5 = pfVar5 + 0x14;
          sVar4 = sVar4 - 1;
        } while (sVar4 != 0);
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 < uVar3);
  }
  (*glad_glDisable)(0xde1);
  return;
}

Assistant:

void Text::_drawList() {
    glEnable(GL_TEXTURE_2D);
    glBindTexture(GL_TEXTURE_2D, _texture.id);

    size_t i, j;
    float ix = x, iy = y;
    for(i = 0; i < text.length(); ++i) {
        // Find the glyph
        texture_glyph_t* glyph = 0;
        for(j = 0; j < _font.glyphs_count; ++j) {
            if (_font.glyphs[j].charcode == text[i]) {
                glyph = &_font.glyphs[j];
                break;
            }
        }
        if(!glyph) {
            continue;
        }

        // // Try to dynamically add kerning (NOT WORKING)
        //float k = 0;
        // if (i > 0) {
        //     for (j = 0; j < glyph->kerning_count; ++j) {
        //         //DEBUG_PRINTLN("text[i]: %s text[i-1]: %s", &text[i], &text[i-1]);
        //         if (glyph->kerning[j].codepoint == text[i-1]) {
        //             k = glyph->kerning[j].kerning;
        //             //DEBUG_PRINTLN("text[i]: %d text[i+1]: %d k: %f", &text[i], &text[i-1], k);
        //             break;
        //         }
        //     }
        // }

        // Calculate the size and location based on the current character's glyph
        float ox = ix + glyph->offset_x + kerning;
        float oy = iy + glyph->offset_y;
        float w  = (float)glyph->width;
        float h  = (float)glyph->height;
        
        // Draw the letter
        glBegin(GL_TRIANGLES);
        glColor4f(1.0, 1.0, 1.0, 1.0);
        glTexCoord2f(glyph->s0, glyph->t0); glVertex3f(ox,     oy    , z);
        glTexCoord2f(glyph->s0, glyph->t1); glVertex3f(ox,     oy - h, z);
        glTexCoord2f(glyph->s1, glyph->t1); glVertex3f(ox + w, oy - h, z);
        glTexCoord2f(glyph->s0, glyph->t0); glVertex3f(ox,     oy    , z);
        glTexCoord2f(glyph->s1, glyph->t1); glVertex3f(ox + w, oy - h, z);
        glTexCoord2f(glyph->s1, glyph->t0); glVertex3f(ox + w, oy    , z);
        glEnd();
        
        // Advance to the next letter's position
        ix += glyph->advance_x;
        iy += glyph->advance_y;
    }

    glDisable(GL_TEXTURE_2D);
}